

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void TestSplit(void)

{
  undefined1 local_2d0 [8];
  begin local_2c8;
  _Elt_pointer local_2b0;
  undefined **local_2a8;
  undefined1 local_2a0;
  _Elt_pointer local_298;
  _Elt_pointer local_290;
  OutputBuffer part2;
  undefined1 local_278 [8];
  InputBuffer part1;
  assertion_result local_260;
  size_t in;
  OutputBuffer buf;
  string str;
  undefined1 local_210 [8];
  lazy_ostream local_208;
  _Elt_pointer local_1f8;
  _Elt_pointer local_1f0;
  const_string local_1e8;
  undefined1 local_1d8 [12];
  char datain [12];
  istream is;
  
  local_2c8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2c8.m_file_name.m_end = "";
  local_2c8.m_line_num = 0x2ed;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)(local_2d0 + 8));
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_2a8 = (undefined **)CONCAT71(local_2a8._1_7_,1);
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001ddb38;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_a4c7c;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_2a8);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"This message is to be split","");
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,str._M_dataplus._M_p,str._M_string_length);
  avro::istream::istream(&is,&buf);
  in = std::istream::readsome((char *)&is,(long)datain);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2f7;
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_1f8 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Elt_pointer)0x1b389c;
  part1.pimpl_.px = (element_type *)local_2d0;
  part2.pimpl_.px = (element_type *)&in;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(in == 0xc);
  local_2d0 = (undefined1  [8])0xc;
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8.m_end = "";
  local_2c8.m_file_name.m_end = (iterator)((ulong)local_2c8.m_file_name.m_end & 0xffffffffffffff00);
  local_2c8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2c8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_290 = (_Elt_pointer)&part1;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001dd7f8;
  local_298 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = (_Elt_pointer)&part2;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,&local_208,&local_1e8,0x2f7,CHECK,CHECK_EQUAL,2,"in",local_2d0 + 8,
             "sizeof(datain)",&local_2a8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2f8;
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_1f8 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Elt_pointer)0x1b389c;
  local_2d0 = (undefined1  [8])std::istream::tellg();
  part1.pimpl_.px = (element_type *)local_278;
  local_278 = (undefined1  [8])0xc;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_2d0 == (undefined1  [8])0xc);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8.m_end = "";
  part2.pimpl_.px = (element_type *)local_2d0;
  local_2c8.m_file_name.m_end = (iterator)((ulong)local_2c8.m_file_name.m_end & 0xffffffffffffff00);
  local_2c8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2c8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001dd7f8;
  local_298 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_290 = (_Elt_pointer)&part1;
  local_2b0 = (_Elt_pointer)&part2;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,&local_208,&local_1e8,0x2f8,CHECK,CHECK_EQUAL,2,
             "static_cast<size_t>(is.tellg())",local_2d0 + 8,"sizeof(datain)",&local_2a8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  avro::OutputBuffer::OutputBuffer(&part2,0);
  if (*(long *)(is.super_istream._80_8_ + 0xa8) != 0) {
    avro::detail::BufferImpl::append(part2.pimpl_.px,(BufferImpl *)is.super_istream._80_8_);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2fc;
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_1f8 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Elt_pointer)0x1b389c;
  local_278 = (undefined1  [8])(part2.pimpl_.px)->size_;
  local_210 = (undefined1  [8])(buf.pimpl_.px)->size_;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_278 == local_210);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8.m_end = "";
  part1.pimpl_.px = (element_type *)local_278;
  local_2c8.m_file_name.m_end = (iterator)((ulong)local_2c8.m_file_name.m_end & 0xffffffffffffff00);
  local_2c8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2c8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = (_Elt_pointer)&part1;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001dd7f8;
  local_298 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_290 = (_Elt_pointer)local_2d0;
  local_2d0 = (undefined1  [8])local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,&local_208,&local_1e8,0x2fc,CHECK,CHECK_EQUAL,2,"part2.size()",local_2d0 + 8
             ,"buf.size()",&local_2a8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  std::istream::tellg();
  avro::OutputBuffer::extractData((OutputBuffer *)&part1,(size_type)&part2);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2ff;
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_1f8 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Elt_pointer)0x1b389c;
  local_210 = (undefined1  [8])(part2.pimpl_.px)->size_;
  local_1d8._0_8_ = str._M_string_length - in;
  local_278 = (undefined1  [8])local_1d8;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == (undefined1  [8])local_1d8._0_8_);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8.m_end = "";
  local_2c8.m_file_name.m_end = (iterator)((ulong)local_2c8.m_file_name.m_end & 0xffffffffffffff00);
  local_2c8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2c8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = (_Elt_pointer)local_2d0;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001dd7f8;
  local_298 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_290 = (_Elt_pointer)local_278;
  local_2d0 = (undefined1  [8])local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,&local_208,&local_1e8,0x2ff,CHECK,CHECK_EQUAL,2,"part2.size()",local_2d0 + 8
             ,"str.size() - in",&local_2a8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  printBuffer(&part1);
  avro::InputBuffer::InputBuffer((InputBuffer *)(local_2d0 + 8),&part2);
  printBuffer((InputBuffer *)(local_2d0 + 8));
  boost::detail::shared_count::~shared_count((shared_count *)&local_2c8.m_file_name.m_end);
  boost::detail::shared_count::~shared_count(&part1.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&part2.pimpl_.pn);
  is.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
  is.super_istream._136_8_ = 0x1dc698;
  is.super_istream._16_8_ = &PTR__istreambuf_001dc720;
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream.field_0x58);
  is.super_istream._16_8_ = sysconf;
  std::locale::~locale((locale *)&is.super_istream.field_0x48);
  is.super_istream._vptr_basic_istream =
       (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
  is.super_istream._136_8_ = 0x1dc6e8;
  is.super_istream._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x88);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSplit()
{
    BOOST_TEST_MESSAGE( "TestSplit");
    {
        const std::string str = "This message is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(str.c_str(), str.size()); 

        char datain[12];
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
        BOOST_CHECK_EQUAL(in, sizeof(datain));
        BOOST_CHECK_EQUAL(static_cast<size_t>(is.tellg()), sizeof(datain));

        OutputBuffer part2;
        part2.append(is.getBuffer());
        BOOST_CHECK_EQUAL(part2.size(), buf.size());
        InputBuffer part1 = part2.extractData(static_cast<size_t>(is.tellg()));

        BOOST_CHECK_EQUAL(part2.size(), str.size() - in);

        printBuffer(part1);
        printBuffer(part2);
    }
}